

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

int __thiscall GGWave::init(GGWave *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  bool bVar2;
  Protocol *pPVar3;
  int16_t iVar4;
  int8_t iVar5;
  int8_t iVar6;
  int8_t iVar7;
  bool bVar8;
  undefined2 uVar9;
  uint in_ECX;
  ulong uVar10;
  long in_RDX;
  uchar uVar11;
  uint uVar12;
  char *__format;
  uint in_R8D;
  uint uVar13;
  int iVar14;
  
  uVar12 = (uint)ctx;
  if ((int)uVar12 < 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      __format = "Negative data size: %d\n";
      uVar10 = (ulong)ctx & 0xffffffff;
      goto LAB_00106041;
    }
  }
  else {
    if (this->m_isTxEnabled != true) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0 && uVar12 != 0) {
        fwrite("Tx is disabled - cannot transmit data with this GGWave instance\n",0x40,1,
               (anonymous_namespace)::g_fptr);
      }
LAB_001060e9:
      iVar14 = (int)CONCAT71((int7)((ulong)in_RDX >> 8),1);
      if (this->m_isRxEnabled != true) {
        return iVar14;
      }
      (this->m_rx).receiving = false;
      (this->m_rx).analyzing = false;
      (this->m_rx).framesLeftToAnalyze = 0;
      (this->m_rx).framesLeftToRecord = 0;
      (this->m_rx).framesToAnalyze = 0;
      (this->m_rx).framesToRecord = 0;
      memset((this->m_rx).spectrum.m_data,0,(long)(this->m_rx).spectrum.m_size << 2);
      memset((this->m_rx).amplitude.m_data,0,(long)(this->m_rx).amplitude.m_size << 2);
      ggmatrix<float>::zero(&(this->m_rx).amplitudeHistory);
      memset((this->m_rx).data.m_data,0,(long)(this->m_rx).data.m_size);
      ggmatrix<unsigned_char>::zero(&(this->m_rx).spectrumHistoryFixed);
      return iVar14;
    }
    uVar10 = (ulong)in_ECX;
    uVar13 = 0x8c;
    if (this->m_isFixedPayloadLength != false) {
      uVar13 = this->m_payloadLength;
    }
    if (((int)uVar13 < (int)uVar12) &&
       (uVar12 = uVar13, (anonymous_namespace)::g_fptr != (FILE *)0x0)) {
      fprintf((anonymous_namespace)::g_fptr,"Truncating data from %d to %d bytes\n",
              (ulong)ctx & 0xffffffff,(ulong)uVar13);
    }
    if (in_R8D < 0x65) {
      (this->m_tx).hasData = false;
      memset((this->m_tx).data.m_data,0,(long)(this->m_tx).data.m_size);
      memset((this->m_dataEncoded).m_data,0,(long)(this->m_dataEncoded).m_size);
      if ((int)uVar12 < 1) goto LAB_001060e9;
      if (in_ECX < 0x16) {
        if ((this->m_tx).protocols.data[in_ECX].enabled == false) {
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            __format = 
            "Protocol %d is not enabled - make sure to enable it before creating the instance\n";
            goto LAB_00106041;
          }
        }
        else {
          bVar2 = this->m_isFixedPayloadLength;
          if ((this->m_tx).protocols.data[in_ECX].extra != '\x02' || bVar2 != false) {
            pPVar3 = (this->m_tx).protocols.data + in_ECX;
            iVar4 = pPVar3->freqStart;
            iVar5 = pPVar3->framesPerTx;
            iVar6 = pPVar3->bytesPerTx;
            iVar7 = pPVar3->extra;
            bVar8 = pPVar3->enabled;
            uVar9 = *(undefined2 *)&pPVar3->field_0xe;
            (this->m_tx).protocol.name = (this->m_tx).protocols.data[in_ECX].name;
            (this->m_tx).protocol.freqStart = iVar4;
            (this->m_tx).protocol.framesPerTx = iVar5;
            (this->m_tx).protocol.bytesPerTx = iVar6;
            (this->m_tx).protocol.extra = iVar7;
            (this->m_tx).protocol.enabled = bVar8;
            *(undefined2 *)&(this->m_tx).protocol.field_0xe = uVar9;
            uVar13 = uVar12;
            if ((bVar2 & 1U) != 0) {
              uVar13 = this->m_payloadLength;
            }
            (this->m_tx).dataLength = uVar13;
            (this->m_tx).sendVolume = (float)(int)in_R8D / 100.0;
            *(this->m_tx).data.m_data = (uchar)uVar13;
            for (uVar10 = 0; (long)uVar10 < (long)(this->m_tx).dataLength; uVar10 = uVar10 + 1) {
              if (uVar10 < uVar12) {
                uVar11 = *(uchar *)(in_RDX + uVar10);
              }
              else {
                uVar11 = '\0';
              }
              (this->m_tx).data.m_data[uVar10 + 1] = uVar11;
              if (this->m_isDSSEnabled != false) {
                pbVar1 = (this->m_tx).data.m_data + uVar10 + 1;
                *pbVar1 = *pbVar1 ^ (anonymous_namespace)::kDSSMagic[(uint)uVar10 & 0x3f];
              }
            }
            (this->m_tx).hasData = true;
            goto LAB_001060e9;
          }
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            fwrite("Mono-tone protocols with variable length are not supported\n",0x3b,1,
                   (anonymous_namespace)::g_fptr);
          }
        }
      }
      else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        __format = "Invalid protocol ID: %d\n";
LAB_00106041:
        fprintf((anonymous_namespace)::g_fptr,__format,uVar10);
        return 0;
      }
    }
    else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      __format = "Invalid volume: %d\n";
      uVar10 = (ulong)in_R8D;
      goto LAB_00106041;
    }
  }
  return 0;
}

Assistant:

bool GGWave::init(int dataSize, const char * dataBuffer, TxProtocolId protocolId, const int volume) {
    if (dataSize < 0) {
        ggprintf("Negative data size: %d\n", dataSize);
        return false;
    }

    // Tx
    if (m_isTxEnabled) {
        const auto maxLength = m_isFixedPayloadLength ? m_payloadLength : kMaxLengthVariable;

        if (dataSize > maxLength) {
            ggprintf("Truncating data from %d to %d bytes\n", dataSize, maxLength);
            dataSize = maxLength;
        }

        if (volume < 0 || volume > 100) {
            ggprintf("Invalid volume: %d\n", volume);
            return false;
        }

        m_tx.hasData = false;
        m_tx.data.zero();
        m_dataEncoded.zero();

        if (dataSize > 0) {
            if (protocolId < 0 || protocolId >= m_tx.protocols.size()) {
                ggprintf("Invalid protocol ID: %d\n", protocolId);
                return false;
            }

            const auto & protocol = m_tx.protocols[protocolId];

            if (protocol.enabled == false) {
                ggprintf("Protocol %d is not enabled - make sure to enable it before creating the instance\n", protocolId);
                return false;
            }

            if (protocol.extra == 2 && m_isFixedPayloadLength == false) {
                ggprintf("Mono-tone protocols with variable length are not supported\n");
                return false;
            }

            m_tx.protocol   = protocol;
            m_tx.dataLength = m_isFixedPayloadLength ? m_payloadLength : dataSize;
            m_tx.sendVolume = ((double)(volume))/100.0f;

            m_tx.data[0] = m_tx.dataLength;
            for (int i = 0; i < m_tx.dataLength; ++i) {
                m_tx.data[i + 1] = i < dataSize ? dataBuffer[i] : 0;
                if (m_isDSSEnabled) {
                    m_tx.data[i + 1] ^= getDSSMagic(i);
                }
            }

            m_tx.hasData = true;
        }
    } else {
        if (dataSize > 0) {
            ggprintf("Tx is disabled - cannot transmit data with this GGWave instance\n");
        }
    }

    // Rx
    if (m_isRxEnabled) {
        m_rx.receiving = false;
        m_rx.analyzing = false;

        m_rx.framesToAnalyze = 0;
        m_rx.framesLeftToAnalyze = 0;
        m_rx.framesToRecord = 0;
        m_rx.framesLeftToRecord = 0;

        m_rx.spectrum.zero();
        m_rx.amplitude.zero();
        m_rx.amplitudeHistory.zero();

        m_rx.data.zero();

        m_rx.spectrumHistoryFixed.zero();
    }

    return true;
}